

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall tchecker::syncprod::system_t::extract_asynchronous_edges(system_t *this)

{
  bool bVar1;
  const_iterator __r;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar2;
  edge_const_shared_ptr_t local_38;
  
  rVar2 = tchecker::system::edges_t::edges(&(this->super_system_t).super_edges_t);
  for (__r._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar2._begin.super_const_iterator._M_current;
      (const_iterator)__r._M_current !=
      rVar2._end.super_const_iterator._M_current.super_const_iterator;
      __r._M_current = __r._M_current + 1) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               &(__r._M_current)->
                super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = is_asynchronous(this,local_38.
                                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
    if (bVar1) {
      add_asynchronous_edge(this,&local_38);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void system_t::extract_asynchronous_edges()
{
  for (tchecker::system::edge_const_shared_ptr_t const & edge : edges())
    if (is_asynchronous(*edge))
      add_asynchronous_edge(edge);
}